

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool cmLocalGeneratorCheckObjectName(string *objName,size_type dir_len,size_type max_total_len)

{
  ulong uVar1;
  long lVar2;
  string_view input;
  cmCryptoHash md5;
  char *local_f0;
  size_t local_e8;
  string local_d0;
  string md5name;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  uVar1 = max_total_len - dir_len;
  if (dir_len <= max_total_len && uVar1 != 0) {
    lVar2 = objName->_M_string_length - uVar1;
    if (objName->_M_string_length < uVar1 || lVar2 == 0) {
      return true;
    }
    uVar1 = std::__cxx11::string::find((char)objName,0x2f);
    if ((uVar1 != 0xffffffffffffffff) ||
       (uVar1 = std::__cxx11::string::rfind((char)objName,0x2f), 0x21 < uVar1 + 1)) {
      cmCryptoHash::cmCryptoHash(&md5,AlgoMD5);
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)objName);
      input._M_str = local_f0;
      input._M_len = local_e8;
      cmCryptoHash::HashString_abi_cxx11_(&local_d0,&md5,input);
      local_80.View_._M_len = local_d0._M_string_length;
      local_80.View_._M_str = local_d0._M_dataplus._M_p;
      local_90._M_str = (objName->_M_dataplus)._M_p;
      local_90._M_len = objName->_M_string_length;
      local_50.View_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&local_90,uVar1,0xffffffffffffffff);
      cmStrCat<>(&md5name,&local_80,&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::_M_assign((string *)objName);
      std::__cxx11::string::~string((string *)&md5name);
      cmCryptoHash::~cmCryptoHash(&md5);
      return lVar2 + 0x20U <= uVar1;
    }
  }
  return false;
}

Assistant:

bool cmLocalGeneratorCheckObjectName(std::string& objName,
                                     std::string::size_type dir_len,
                                     std::string::size_type max_total_len)
{
  // Enforce the maximum file name length if possible.
  std::string::size_type max_obj_len = max_total_len;
  if (dir_len < max_total_len) {
    max_obj_len = max_total_len - dir_len;
    if (objName.size() > max_obj_len) {
      // The current object file name is too long.  Try to shorten it.
      return cmLocalGeneratorShortenObjectName(objName, max_obj_len);
    }
    // The object file name is short enough.
    return true;
  }
  // The build directory in which the object will be stored is
  // already too deep.
  return false;
}